

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_quantize_avx.c
# Opt level: O3

void aom_quantize_b_32x32_avx
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  auVar17._8_4_ = 0x10001;
  auVar17._0_8_ = 0x1000100010001;
  auVar17._12_4_ = 0x10001;
  auVar8 = vpaddw_avx(auVar17,*(undefined1 (*) [16])zbin_ptr);
  auVar10 = vpsrlw_avx(auVar8,1);
  auVar16 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
  auVar8 = vpaddw_avx(auVar17,*(undefined1 (*) [16])round_ptr);
  auVar6 = vpsrlw_avx(auVar8,1);
  auVar8 = *(undefined1 (*) [16])quant_ptr;
  auVar17 = *(undefined1 (*) [16])dequant_ptr;
  auVar15 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar11 = vpackssdw_avx(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar3 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + 8),
                         *(undefined1 (*) [16])(coeff_ptr + 0xc));
  auVar2 = vpabsw_avx(auVar11);
  auVar12 = vpabsw_avx(auVar3);
  auVar4 = vpcmpgtw_avx(auVar10,auVar2);
  auVar10 = vpshufd_avx(auVar10,0xee);
  auVar10 = vpaddw_avx(auVar16,auVar10);
  auVar7 = vpcmpgtw_avx(auVar12,auVar10);
  auVar14 = vpor_avx(auVar7,auVar4 ^ auVar16);
  if (auVar14 == (undefined1  [16])0x0) {
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    dqcoeff_ptr[8] = 0;
    dqcoeff_ptr[9] = 0;
    dqcoeff_ptr[10] = 0;
    dqcoeff_ptr[0xb] = 0;
    dqcoeff_ptr[0xc] = 0;
    dqcoeff_ptr[0xd] = 0;
    dqcoeff_ptr[0xe] = 0;
    dqcoeff_ptr[0xf] = 0;
    local_18 = vpshufd_avx(auVar6,0xee);
    local_28 = vpshufd_avx(auVar8,0xee);
    auVar14 = vpshufd_avx(auVar15,0xee);
    auVar11 = vpshufd_avx(auVar17,0xee);
    auVar9 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar2 = vpaddsw_avx(auVar2,auVar6);
    auVar14 = vpmulhw_avx(auVar2,auVar8);
    auVar2 = vpaddw_avx(auVar14,auVar2);
    auVar14 = vpmullw_avx(auVar2,auVar15);
    auVar2 = vpmulhw_avx(auVar2,auVar15);
    auVar14 = vpsrlw_avx(auVar14,0xf);
    auVar2 = vpaddw_avx(auVar2,auVar2);
    auVar2 = vpor_avx(auVar2,auVar14);
    local_18 = vpshufd_avx(auVar6,0xee);
    local_28 = vpshufd_avx(auVar8,0xee);
    auVar14 = vpshufd_avx(auVar15,0xee);
    auVar8 = vpaddsw_avx(auVar12,local_18);
    auVar15 = vpmulhw_avx(auVar8,local_28);
    auVar8 = vpaddw_avx(auVar15,auVar8);
    auVar15 = vpmullw_avx(auVar8,auVar14);
    auVar8 = vpmulhw_avx(auVar8,auVar14);
    auVar15 = vpsrlw_avx(auVar15,0xf);
    auVar8 = vpaddw_avx(auVar8,auVar8);
    auVar8 = vpor_avx(auVar8,auVar15);
    auVar15 = vpsignw_avx(auVar2,auVar11);
    auVar8 = vpsignw_avx(auVar8,auVar3);
    auVar2 = vpandn_avx(auVar4,auVar15);
    auVar15 = vpand_avx(auVar8,auVar7);
    auVar11 = vpsraw_avx(auVar2,0xf);
    auVar12 = vpunpcklwd_avx(auVar2,auVar11);
    auVar8 = vpunpckhwd_avx(auVar2,auVar11);
    *(undefined1 (*) [16])qcoeff_ptr = auVar12;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar8;
    auVar13 = vpsraw_avx(auVar15,0xf);
    auVar12 = vpunpcklwd_avx(auVar15,auVar13);
    auVar8 = vpunpckhwd_avx(auVar15,auVar13);
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar12;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = auVar8;
    auVar8 = vpabsw_avx(auVar2);
    auVar12 = vpmovzxwd_avx(auVar11);
    auVar3 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
    auVar11 = vpmullw_avx(auVar8,auVar17);
    auVar8 = vpmulhw_avx(auVar8,auVar17);
    auVar6 = vpunpcklwd_avx(auVar11,auVar8);
    auVar8 = vpunpckhwd_avx(auVar11,auVar8);
    auVar6 = vpsrld_avx(auVar6,1);
    auVar11 = vpsrld_avx(auVar8,1);
    auVar8 = vpsubd_avx(auVar6 ^ auVar12,auVar12);
    auVar12 = vpsubd_avx(auVar11 ^ auVar3,auVar3);
    *(undefined1 (*) [16])dqcoeff_ptr = auVar8;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = auVar12;
    auVar11 = vpshufd_avx(auVar17,0xee);
    auVar8 = vpabsw_avx(auVar15);
    auVar17 = vpmovzxwd_avx(auVar13);
    auVar3 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
    auVar12 = vpmullw_avx(auVar8,auVar11);
    auVar8 = vpmulhw_avx(auVar8,auVar11);
    auVar6 = vpunpcklwd_avx(auVar12,auVar8);
    auVar8 = vpunpckhwd_avx(auVar12,auVar8);
    auVar6 = vpsrld_avx(auVar6,1);
    auVar12 = vpsrld_avx(auVar8,1);
    auVar8 = vpsubd_avx(auVar6 ^ auVar17,auVar17);
    auVar17 = vpsubd_avx(auVar12 ^ auVar3,auVar3);
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar8;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = auVar17;
    auVar17 = vpsubw_avx(*(undefined1 (*) [16])iscan,auVar4 ^ auVar16);
    auVar12 = vpsubw_avx(*(undefined1 (*) [16])(iscan + 8),auVar7);
    auVar8 = vpcmpeqw_avx(auVar2,(undefined1  [16])0x0);
    auVar8 = vpandn_avx(auVar8,auVar17);
    auVar17 = vpcmpeqw_avx(auVar15,(undefined1  [16])0x0);
    auVar17 = vpandn_avx(auVar17,auVar12);
    auVar8 = vpmaxsw_avx(auVar8,auVar17);
    auVar9 = ZEXT1664(auVar8);
  }
  auVar8 = auVar9._0_16_;
  if (0x10 < n_coeffs) {
    lVar5 = 0x10;
    do {
      auVar15 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + lVar5),
                              *(undefined1 (*) [16])(coeff_ptr + lVar5 + 4));
      auVar2 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + lVar5 + 8),
                             *(undefined1 (*) [16])(coeff_ptr + lVar5 + 0xc));
      auVar8 = vpabsw_avx(auVar15);
      auVar17 = vpabsw_avx(auVar2);
      auVar12 = vpcmpgtw_avx(auVar8,auVar10);
      auVar3 = vpcmpgtw_avx(auVar17,auVar10);
      auVar16 = vpor_avx(auVar3,auVar12);
      if (auVar16 == (undefined1  [16])0x0) {
        ptVar1 = qcoeff_ptr + lVar5;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar5;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = qcoeff_ptr + lVar5 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar5 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
      }
      else {
        auVar8 = vpaddsw_avx(auVar8,local_18);
        auVar16 = vpmulhw_avx(auVar8,local_28);
        auVar8 = vpaddw_avx(auVar16,auVar8);
        auVar16 = vpmullw_avx(auVar8,auVar14);
        auVar8 = vpmulhw_avx(auVar8,auVar14);
        auVar16 = vpsrlw_avx(auVar16,0xf);
        auVar8 = vpaddw_avx(auVar8,auVar8);
        auVar16 = vpor_avx(auVar8,auVar16);
        auVar8 = vpaddsw_avx(auVar17,local_18);
        auVar17 = vpmulhw_avx(auVar8,local_28);
        auVar8 = vpaddw_avx(auVar17,auVar8);
        auVar17 = vpmullw_avx(auVar8,auVar14);
        auVar8 = vpmulhw_avx(auVar8,auVar14);
        auVar17 = vpsrlw_avx(auVar17,0xf);
        auVar8 = vpaddw_avx(auVar8,auVar8);
        auVar8 = vpor_avx(auVar8,auVar17);
        auVar17 = vpsignw_avx(auVar16,auVar15);
        auVar8 = vpsignw_avx(auVar8,auVar2);
        auVar17 = vpand_avx(auVar12,auVar17);
        auVar15 = vpand_avx(auVar3,auVar8);
        auVar16 = vpsraw_avx(auVar17,0xf);
        auVar2 = vpunpcklwd_avx(auVar17,auVar16);
        auVar8 = vpunpckhwd_avx(auVar17,auVar16);
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5) = auVar2;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 4) = auVar8;
        auVar6 = vpsraw_avx(auVar15,0xf);
        auVar2 = vpunpcklwd_avx(auVar15,auVar6);
        auVar8 = vpunpckhwd_avx(auVar15,auVar6);
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 8) = auVar2;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0xc) = auVar8;
        auVar8 = vpabsw_avx(auVar17);
        auVar2 = vpmovzxwd_avx(auVar16);
        auVar4 = vpunpckhwd_avx(auVar16,(undefined1  [16])0x0);
        auVar16 = vpmullw_avx(auVar8,auVar11);
        auVar8 = vpmulhw_avx(auVar8,auVar11);
        auVar7 = vpunpcklwd_avx(auVar16,auVar8);
        auVar8 = vpunpckhwd_avx(auVar16,auVar8);
        auVar7 = vpsrld_avx(auVar7,1);
        auVar16 = vpsrld_avx(auVar8,1);
        auVar8 = vpsubd_avx(auVar2 ^ auVar7,auVar2);
        auVar2 = vpsubd_avx(auVar4 ^ auVar16,auVar4);
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5) = auVar8;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 4) = auVar2;
        auVar8 = vpabsw_avx(auVar15);
        auVar2 = vpmovzxwd_avx(auVar6);
        auVar4 = vpunpckhwd_avx(auVar6,(undefined1  [16])0x0);
        auVar16 = vpmullw_avx(auVar8,auVar11);
        auVar8 = vpmulhw_avx(auVar8,auVar11);
        auVar7 = vpunpcklwd_avx(auVar16,auVar8);
        auVar8 = vpunpckhwd_avx(auVar16,auVar8);
        auVar7 = vpsrld_avx(auVar7,1);
        auVar16 = vpsrld_avx(auVar8,1);
        auVar8 = vpsubd_avx(auVar7 ^ auVar2,auVar2);
        auVar2 = vpsubd_avx(auVar4 ^ auVar16,auVar4);
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 8) = auVar8;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0xc) = auVar2;
        auVar2 = vpsubw_avx(*(undefined1 (*) [16])(iscan + lVar5),auVar12);
        auVar12 = vpsubw_avx(*(undefined1 (*) [16])(iscan + lVar5 + 8),auVar3);
        auVar8 = vpcmpeqw_avx(auVar17,(undefined1  [16])0x0);
        auVar8 = vpandn_avx(auVar8,auVar2);
        auVar17 = vpcmpeqw_avx(auVar15,(undefined1  [16])0x0);
        auVar17 = vpandn_avx(auVar17,auVar12);
        auVar8 = vpmaxsw_avx(auVar8,auVar17);
        auVar8 = vpmaxsw_avx(auVar9._0_16_,auVar8);
        auVar9 = ZEXT1664(auVar8);
      }
      auVar8 = auVar9._0_16_;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 < n_coeffs);
  }
  auVar17 = vpshufd_avx(auVar8,0xe);
  auVar8 = vpmaxsw_avx(auVar8,auVar17);
  auVar17 = vpshuflw_avx(auVar8,0xe);
  auVar8 = vpmaxsw_avx(auVar8,auVar17);
  auVar17 = vpshuflw_avx(auVar8,1);
  auVar8 = vpmaxsw_avx(auVar8,auVar17);
  vpextrw_avx(auVar8,1);
  return;
}

Assistant:

void aom_quantize_b_32x32_avx(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                              const int16_t *zbin_ptr, const int16_t *round_ptr,
                              const int16_t *quant_ptr,
                              const int16_t *quant_shift_ptr,
                              tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                              const int16_t *dequant_ptr, uint16_t *eob_ptr,
                              const int16_t *scan, const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m256i big_zero = _mm256_setzero_si256();
  int index;
  const int log_scale = 1;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i eob = zero, eob0;

  (void)scan;

  // Setup global values.
  // The 32x32 halves zbin and round.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, one);
  zbin = _mm_srli_epi16(zbin, 1);
  // x86 has no "greater *or equal*" comparison. Subtract 1 from zbin so
  // it is a strict "greater" comparison.
  zbin = _mm_sub_epi16(zbin, one);

  round = _mm_load_si128((const __m128i *)round_ptr);
  round = _mm_add_epi16(round, one);
  round = _mm_srli_epi16(round, 1);

  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Do DC and first 15 AC.
  coeff0 = load_tran_low(coeff_ptr);
  coeff1 = load_tran_low(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC.
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_test_all_zeros(all_zero, all_zero)) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), big_zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs.
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs.
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr);
    store_tran_low(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < n_coeffs; index += 16) {
    coeff0 = load_tran_low(coeff_ptr + index);
    coeff1 = load_tran_low(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_test_all_zeros(all_zero, all_zero)) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), big_zero);
      continue;
    }

    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr + index);
    store_tran_low(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}